

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

void __thiscall tonk::UDPSocket::Shutdown(UDPSocket *this)

{
  shared_ptr<asio::io_context::strand> *in_RDI;
  shared_ptr<asio::io_context::strand> *in_stack_ffffffffffffffd8;
  
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator=((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               *)in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<asio::io_context::strand>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<asio::io_context::strand>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<asio::io_context::strand>::~shared_ptr
            ((shared_ptr<asio::io_context::strand> *)0x190cf1);
  return;
}

Assistant:

void UDPSocket::Shutdown()
{
    TONK_DEBUG_ASSERT(OutstandingSends == 0);
    TONK_DEBUG_ASSERT(OutstandingRecvs == 0);

    Socket = nullptr;
    AsioConnectStrand = nullptr;
}